

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::LayoutBindingNegativeCase::init
          (LayoutBindingNegativeCase *this,EVP_PKEY_CTX *ctx)

{
  bool *pbVar1;
  vector<int,_std::allocator<int>_> *this_00;
  deUint32 *pdVar2;
  ShaderType SVar3;
  ErrorType EVar4;
  GLint GVar5;
  bool bVar6;
  int iVar7;
  deUint32 dVar8;
  ContextType ctxType;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestLog *pTVar10;
  NotSupportedError *this_01;
  uint uVar11;
  uint uVar12;
  int ndx;
  sbyte sVar13;
  GLint binding;
  GLint maxTessCtrlUnits;
  GLint maxFragmentUnits;
  GLint maxVertexUnits;
  GLint maxTessEvalUnits;
  GLint maxCombinedUnits;
  GLint numBindingPoints;
  value_type_conflict1 local_1cc;
  vector<int,_std::allocator<int>_> *local_1c8;
  Random rnd;
  Random rnd_1;
  long lVar9;
  
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar7);
  dVar8 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init(&rnd.m_rnd,dVar8 ^ 0xff23a4);
  numBindingPoints = 0;
  maxVertexUnits = 0;
  maxFragmentUnits = 0;
  maxCombinedUnits = 0;
  maxTessCtrlUnits = 0;
  maxTessEvalUnits = 0;
  bVar6 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_EXT_tessellation_shader")
  ;
  iVar7 = 4;
  sVar13 = 2;
  if (bVar6) {
    this->m_tessSupport = true;
  }
  else {
    ctxType.super_ApiType.m_bits =
         (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    bVar6 = glu::contextSupports(ctxType,(ApiType)0x23);
    this->m_tessSupport = bVar6;
    if (!bVar6) {
      if ((this->m_shaderType & ~SHADERTYPE_FRAGMENT) == SHADERTYPE_TESS_CONTROL) {
        this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (this_01,"Tesselation shaders not supported",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                   ,0x309);
        goto LAB_0044366d;
      }
      sVar13 = 1;
      iVar7 = 2;
    }
  }
  (**(code **)(lVar9 + 0x868))(this->m_maxVertexUnitsEnum,&maxVertexUnits);
  (**(code **)(lVar9 + 0x868))(this->m_maxFragmentUnitsEnum,&maxFragmentUnits);
  pbVar1 = &this->m_tessSupport;
  if (*pbVar1 == true) {
    (**(code **)(lVar9 + 0x868))(this->m_maxTessCtrlUnitsEnum,&maxTessCtrlUnits);
    (**(code **)(lVar9 + 0x868))(this->m_maxTessEvalUnitsEnum,&maxTessEvalUnits);
  }
  (**(code **)(lVar9 + 0x868))(this->m_maxCombinedUnitsEnum,&maxCombinedUnits);
  (**(code **)(lVar9 + 0x868))(this->m_maxBindingPointEnum,&numBindingPoints);
  dVar8 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar8,"Querying available uniform numbers failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                  ,0x318);
  rnd_1.m_rnd._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pdVar2 = &rnd_1.m_rnd.z;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
  std::operator<<((ostream *)pdVar2,"Maximum units for uniform type in the vertex shader: ");
  std::ostream::operator<<(pdVar2,maxVertexUnits);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&rnd_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar2);
  rnd_1.m_rnd._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pdVar2 = &rnd_1.m_rnd.z;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
  std::operator<<((ostream *)pdVar2,"Maximum units for uniform type in the fragment shader: ");
  std::ostream::operator<<(pdVar2,maxFragmentUnits);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&rnd_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar2);
  if (*pbVar1 == true) {
    rnd_1.m_rnd._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    pdVar2 = &rnd_1.m_rnd.z;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
    std::operator<<((ostream *)pdVar2,
                    "Maximum units for uniform type in the tessellation control shader: ");
    std::ostream::operator<<(pdVar2,maxTessCtrlUnits);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&rnd_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar2);
    rnd_1.m_rnd._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    pdVar2 = &rnd_1.m_rnd.z;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
    std::operator<<((ostream *)pdVar2,
                    "Maximum units for uniform type in the tessellation evaluation shader: ");
    std::ostream::operator<<(pdVar2,maxTessCtrlUnits);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&rnd_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar2);
  }
  rnd_1.m_rnd._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pdVar2 = &rnd_1.m_rnd.z;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
  std::operator<<((ostream *)pdVar2,"Maximum combined units for uniform type: ");
  std::ostream::operator<<(pdVar2,maxCombinedUnits);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&rnd_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar2);
  rnd_1.m_rnd._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pdVar2 = &rnd_1.m_rnd.z;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
  std::operator<<((ostream *)pdVar2,"Maximum binding point for uniform type: ");
  std::ostream::operator<<(pdVar2,numBindingPoints + -1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&rnd_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar2);
  uVar11 = maxTessEvalUnits;
  switch(this->m_shaderType) {
  case SHADERTYPE_VERTEX:
    uVar11 = maxVertexUnits;
    break;
  case SHADERTYPE_FRAGMENT:
    uVar11 = maxFragmentUnits;
    break;
  case SHADERTYPE_TESS_CONTROL:
    uVar11 = maxTessCtrlUnits;
    break;
  case SHADERTYPE_TESS_EVALUATION:
    break;
  case SHADERTYPE_ALL:
    uVar12 = maxFragmentUnits;
    if (maxVertexUnits < maxFragmentUnits) {
      uVar12 = maxVertexUnits;
    }
    if (maxTessCtrlUnits < maxTessEvalUnits) {
      uVar11 = maxTessCtrlUnits;
    }
    if ((int)uVar12 < (int)uVar11) {
      uVar11 = uVar12;
    }
    if (maxCombinedUnits / iVar7 <= (int)uVar11) {
      uVar11 = maxCombinedUnits / iVar7;
    }
    break;
  default:
    uVar11 = 0;
  }
  if (this->m_testType - TESTTYPE_BINDING_MULTIPLE < 3) {
    if (this->m_errorType == ERRORTYPE_CONTRADICTORY) {
      if ((int)uVar11 < 3) {
        this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (this_01,"Not enough uniforms available for test",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                   ,0x350);
        goto LAB_0044366d;
      }
      uVar11 = uVar11 - 1;
    }
    else if ((int)uVar11 < 2) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_01,"Not enough uniforms available for test",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                 ,0x356);
      goto LAB_0044366d;
    }
    uVar12 = 7;
    if (uVar11 < 7) {
      uVar12 = uVar11;
    }
    iVar7 = de::Random::getInt(&rnd,2,uVar12);
LAB_0044318d:
    this->m_numBindings = iVar7;
  }
  else if (this->m_testType < TESTTYPE_BINDING_MULTIPLE) {
    iVar7 = 1;
    goto LAB_0044318d;
  }
  GVar5 = numBindingPoints;
  SVar3 = this->m_shaderType;
  if ((SVar3 == SHADERTYPE_VERTEX) || (SVar3 == SHADERTYPE_ALL)) {
    iVar7 = this->m_numBindings;
    if (maxVertexUnits < iVar7) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_01,"Vertex shader: not enough uniforms available for test",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                 ,0x361);
      goto LAB_0044366d;
    }
    if ((SVar3 == SHADERTYPE_ALL) || (SVar3 == SHADERTYPE_FRAGMENT)) goto LAB_004431c9;
  }
  else if (SVar3 == SHADERTYPE_FRAGMENT) {
    iVar7 = this->m_numBindings;
LAB_004431c9:
    if (maxFragmentUnits < iVar7) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_01,"Fragment shader: not enough uniforms available for test",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                 ,0x364);
      goto LAB_0044366d;
    }
  }
  if (*pbVar1 == true) {
    if (((SVar3 == SHADERTYPE_ALL) || (SVar3 == SHADERTYPE_TESS_CONTROL)) &&
       (maxTessCtrlUnits < this->m_numBindings)) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_01,"Tessellation control shader: not enough uniforms available for test",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                 ,0x367);
      goto LAB_0044366d;
    }
    if (SVar3 - SHADERTYPE_TESS_EVALUATION < 2) {
      if (maxTessEvalUnits < this->m_numBindings) {
        this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (this_01,"Tessellation evaluation shader: not enough uniforms available for test",
                   (char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                   ,0x36a);
        goto LAB_0044366d;
      }
      goto LAB_0044320b;
    }
  }
  else {
LAB_0044320b:
    if ((SVar3 == SHADERTYPE_ALL) && (maxCombinedUnits < this->m_numBindings << sVar13)) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_01,"Not enough uniforms available for test",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                 ,0x36d);
      goto LAB_0044366d;
    }
  }
  if (numBindingPoints < this->m_numBindings) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Not enough binding points available for test",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
               ,0x371);
LAB_0044366d:
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if ((numBindingPoints == this->m_numBindings) && (this->m_errorType == ERRORTYPE_CONTRADICTORY)) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Not enough binding points available for test",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
               ,0x374);
    goto LAB_0044366d;
  }
  local_1cc = 0;
  dVar8 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init(&rnd_1.m_rnd,dVar8 ^ 0xff23a4);
  EVar4 = this->m_errorType;
  if (EVar4 == ERRORTYPE_CONTRADICTORY) {
    std::vector<int,_std::allocator<int>_>::push_back(&this->m_vertexShaderBinding,&local_1cc);
    binding = (local_1cc + 1) % GVar5;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&this->m_fragmentShaderBinding,&binding);
    binding = (local_1cc + 2) % GVar5;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&this->m_tessCtrlShaderBinding,&binding);
    binding = (local_1cc + 3) % GVar5;
  }
  else {
    if (EVar4 == ERRORTYPE_LESS_THAN_ZERO) {
      iVar7 = de::Random::getInt(&rnd_1,1,this->m_numBindings);
      binding = -iVar7;
      std::vector<int,_std::allocator<int>_>::push_back(&this->m_vertexShaderBinding,&binding);
      std::vector<int,_std::allocator<int>_>::push_back(&this->m_fragmentShaderBinding,&binding);
      std::vector<int,_std::allocator<int>_>::push_back(&this->m_tessCtrlShaderBinding,&binding);
      std::vector<int,_std::allocator<int>_>::push_back(&this->m_tessEvalShaderBinding,&binding);
      goto LAB_004433af;
    }
    if (EVar4 != ERRORTYPE_OVER_MAX_UNITS) goto LAB_004433af;
    iVar7 = GVar5 + 1;
    binding = iVar7 - this->m_numBindings;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->m_vertexShaderBinding,&binding)
    ;
    binding = iVar7 - this->m_numBindings;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&this->m_fragmentShaderBinding,&binding);
    binding = iVar7 - this->m_numBindings;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&this->m_tessCtrlShaderBinding,&binding);
    binding = iVar7 - this->m_numBindings;
  }
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->m_tessEvalShaderBinding,&binding)
  ;
LAB_004433af:
  this_00 = &this->m_tessCtrlShaderBinding;
  local_1c8 = &this->m_tessEvalShaderBinding;
  for (iVar7 = 1; iVar7 < this->m_numBindings; iVar7 = iVar7 + 1) {
    binding = *(this->m_vertexShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + iVar7;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->m_vertexShaderBinding,&binding)
    ;
    binding = *(this->m_fragmentShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl
               .super__Vector_impl_data._M_start + iVar7;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&this->m_fragmentShaderBinding,&binding);
    binding = *(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start + iVar7;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&binding);
    binding = *(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start + iVar7;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_1c8,&binding);
  }
  rnd_1.m_rnd._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pdVar2 = &rnd_1.m_rnd.z;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
  std::operator<<((ostream *)pdVar2,"Creating test shaders");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&rnd_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar2);
  iVar7 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
  this->m_program = (ShaderProgram *)CONCAT44(extraout_var_00,iVar7);
  pTVar10 = glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                            (ShaderProgram *)CONCAT44(extraout_var_00,iVar7));
  return (int)pTVar10;
}

Assistant:

void LayoutBindingNegativeCase::init (void)
{
	// Decide appropriate binding points for the vertex and fragment shaders
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	de::Random				rnd					(deStringHash(getName()) ^ 0xff23a4);
	glw::GLint				numBindingPoints	= 0;	// Number of binding points
	glw::GLint				maxVertexUnits		= 0;	// Available uniforms in the vertex shader
	glw::GLint				maxFragmentUnits	= 0;	// Available uniforms in the fragment shader
	glw::GLint				maxCombinedUnits	= 0;	// Available uniforms in all the shader stages combined
	glw::GLint				maxTessCtrlUnits	= 0;	// Available uniforms in tessellation control shader
	glw::GLint				maxTessEvalUnits	= 0;	// Available uniforms in tessellation evaluation shader
	glw::GLint				maxUnits			= 0;	// Maximum available uniforms for this test

	m_tessSupport = m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_shader")
					|| contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!m_tessSupport && (m_shaderType == SHADERTYPE_TESS_EVALUATION || m_shaderType == SHADERTYPE_TESS_CONTROL))
		TCU_THROW(NotSupportedError, "Tesselation shaders not supported");

	int numShaderStages = m_tessSupport ? 4 : 2;

	gl.getIntegerv(m_maxVertexUnitsEnum, &maxVertexUnits);
	gl.getIntegerv(m_maxFragmentUnitsEnum, &maxFragmentUnits);

	if (m_tessSupport)
	{
		gl.getIntegerv(m_maxTessCtrlUnitsEnum, &maxTessCtrlUnits);
		gl.getIntegerv(m_maxTessEvalUnitsEnum, &maxTessEvalUnits);
	}

	gl.getIntegerv(m_maxCombinedUnitsEnum, &maxCombinedUnits);
	gl.getIntegerv(m_maxBindingPointEnum, &numBindingPoints);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Querying available uniform numbers failed");

	m_testCtx.getLog() << tcu::TestLog::Message << "Maximum units for uniform type in the vertex shader: " << maxVertexUnits << tcu::TestLog::EndMessage;
	m_testCtx.getLog() << tcu::TestLog::Message << "Maximum units for uniform type in the fragment shader: " << maxFragmentUnits << tcu::TestLog::EndMessage;

	if (m_tessSupport)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Maximum units for uniform type in the tessellation control shader: " << maxTessCtrlUnits << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "Maximum units for uniform type in the tessellation evaluation shader: " << maxTessCtrlUnits << tcu::TestLog::EndMessage;
	}

	m_testCtx.getLog() << tcu::TestLog::Message << "Maximum combined units for uniform type: " << maxCombinedUnits << tcu::TestLog::EndMessage;
	m_testCtx.getLog() << tcu::TestLog::Message << "Maximum binding point for uniform type: " << numBindingPoints-1 << tcu::TestLog::EndMessage;

	// Select maximum number of uniforms used for the test
	switch (m_shaderType)
	{
		case SHADERTYPE_VERTEX:
			maxUnits = maxVertexUnits;
			break;

		case SHADERTYPE_FRAGMENT:
			maxUnits = maxFragmentUnits;
			break;

		case SHADERTYPE_ALL:
			maxUnits = de::min(de::min(de::min(maxVertexUnits, maxFragmentUnits), de::min(maxTessCtrlUnits, maxTessEvalUnits)), maxCombinedUnits/numShaderStages);
			break;

		case SHADERTYPE_TESS_CONTROL:
			maxUnits = maxTessCtrlUnits;
			break;

		case SHADERTYPE_TESS_EVALUATION:
			maxUnits = maxTessEvalUnits;
			break;

		default:
			DE_ASSERT(false);
	}

	// Select the number of uniforms (= bindings) used for this test
	switch (m_testType)
	{
		case TESTTYPE_BINDING_SINGLE:
		case TESTTYPE_BINDING_MAX:
			m_numBindings = 1;
			break;

		case TESTTYPE_BINDING_MULTIPLE:
		case TESTTYPE_BINDING_ARRAY:
		case TESTTYPE_BINDING_MAX_ARRAY:
			if (m_errorType == ERRORTYPE_CONTRADICTORY)
			{
				// leave room for contradictory case
				if (maxUnits < 3)
					TCU_THROW(NotSupportedError, "Not enough uniforms available for test");
				m_numBindings = rnd.getInt(2, deMin32(MAX_UNIFORM_ARRAY_SIZE, maxUnits-1));
			}
			else
			{
				if (maxUnits < 2)
					TCU_THROW(NotSupportedError, "Not enough uniforms available for test");
				m_numBindings = rnd.getInt(2, deMin32(MAX_UNIFORM_ARRAY_SIZE, maxUnits));
			}
			break;

		default:
			DE_ASSERT(false);
	}

	// Check that we have enough uniforms in different shaders to perform the tests
	if (((m_shaderType == SHADERTYPE_VERTEX) || (m_shaderType == SHADERTYPE_ALL)) && (maxVertexUnits < m_numBindings) )
		TCU_THROW(NotSupportedError, "Vertex shader: not enough uniforms available for test");

	if (((m_shaderType == SHADERTYPE_FRAGMENT) || (m_shaderType == SHADERTYPE_ALL)) && (maxFragmentUnits < m_numBindings) )
		TCU_THROW(NotSupportedError, "Fragment shader: not enough uniforms available for test");

	if (m_tessSupport && ((m_shaderType == SHADERTYPE_TESS_CONTROL) || (m_shaderType == SHADERTYPE_ALL)) && (maxTessCtrlUnits < m_numBindings) )
		TCU_THROW(NotSupportedError, "Tessellation control shader: not enough uniforms available for test");

	if (m_tessSupport && ((m_shaderType == SHADERTYPE_TESS_EVALUATION) || (m_shaderType == SHADERTYPE_ALL)) && (maxTessEvalUnits < m_numBindings) )
		TCU_THROW(NotSupportedError, "Tessellation evaluation shader: not enough uniforms available for test");

	if ((m_shaderType == SHADERTYPE_ALL) && (maxCombinedUnits < m_numBindings*numShaderStages) )
		TCU_THROW(NotSupportedError, "Not enough uniforms available for test");

	// Check that we have enough binding points to perform the tests
	if (numBindingPoints < m_numBindings)
		TCU_THROW(NotSupportedError, "Not enough binding points available for test");

	if (m_errorType == ERRORTYPE_CONTRADICTORY && numBindingPoints == m_numBindings)
		TCU_THROW(NotSupportedError, "Not enough binding points available for test");

	// Initialize the binding points i.e. populate the two binding point vectors
	initBindingPoints(0, numBindingPoints);

	// Generate the shader program - note: this must be done after deciding the binding points
	DE_ASSERT(!m_program);
	m_testCtx.getLog() << tcu::TestLog::Message << "Creating test shaders" << tcu::TestLog::EndMessage;
	m_program = generateShaders();
	m_testCtx.getLog() << *m_program;
}